

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

void __thiscall slang::ast::ASTContext::addAssertionBacktrace(ASTContext *this,Diagnostic *diag)

{
  SymbolKind SVar1;
  AssertionInstanceDetails *pAVar2;
  Diagnostic *this_00;
  char *pcVar3;
  string_view arg;
  size_t sVar4;
  
  do {
    pAVar2 = this->assertionInstance;
    if (pAVar2 == (AssertionInstanceDetails *)0x0) {
      return;
    }
    if (((ulong)pAVar2->argExpansionLoc & 0xfffffff) == 0) {
      if (pAVar2->symbol->kind == Checker) {
        return;
      }
      if ((pAVar2->symbol->name)._M_len != 0) {
        this_00 = Diagnostic::addNote(diag,(DiagCode)0x540008,pAVar2->instanceLoc);
        SVar1 = pAVar2->symbol->kind;
        if (SVar1 == LetDecl) {
          sVar4 = 0xf;
          pcVar3 = "let declaration";
        }
        else {
          sVar4 = 8;
          if (SVar1 == Property) {
            pcVar3 = "property";
          }
          else {
            pcVar3 = "sequence";
          }
        }
        arg._M_str = pcVar3;
        arg._M_len = sVar4;
        Diagnostic::operator<<(this_00,arg);
        Diagnostic::operator<<(this_00,pAVar2->symbol->name);
      }
    }
    else {
      Diagnostic::addNote(diag,(DiagCode)0x70001,pAVar2->argExpansionLoc);
    }
    this = pAVar2->prevContext;
  } while (this != (ASTContext *)0x0);
  return;
}

Assistant:

void ASTContext::addAssertionBacktrace(Diagnostic& diag) const {
    if (!assertionInstance)
        return;

    auto& inst = *assertionInstance;
    if (inst.argExpansionLoc) {
        diag.addNote(diag::NoteExpandedHere, inst.argExpansionLoc);
    }
    else {
        // We ignore checkers here; they have specialized handling in Compilation.cpp.
        SLANG_ASSERT(inst.symbol);
        if (inst.symbol->kind == SymbolKind::Checker)
            return;

        if (!inst.symbol->name.empty()) {
            auto& note = diag.addNote(diag::NoteWhileExpanding, inst.instanceLoc);
            switch (inst.symbol->kind) {
                case SymbolKind::Sequence:
                    note << "sequence"sv;
                    break;
                case SymbolKind::Property:
                    note << "property"sv;
                    break;
                case SymbolKind::LetDecl:
                    note << "let declaration"sv;
                    break;
                default:
                    SLANG_UNREACHABLE;
            }
            note << inst.symbol->name;
        }
    }

    if (inst.prevContext)
        inst.prevContext->addAssertionBacktrace(diag);
}